

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetgen.cpp
# Opt level: O0

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  Complex dto_1;
  string local_e8;
  undefined1 local_c8 [8];
  Simple dto;
  string serial;
  string local_60 [8];
  string cmd;
  string payload;
  uint64_t seq;
  uint64_t param;
  int is_simple;
  
  param._4_4_ = 0;
  std::__cxx11::string::string((string *)(cmd.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_60);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_60);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(cmd.field_2._M_local_buf + 8));
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&param);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&seq);
  std::istream::operator>>(piVar1,(ulong *)(payload.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(dto.payload.field_2._M_local_buf + 8));
  if ((int)param == 0) {
    std::__cxx11::string::string((string *)&local_168,local_60);
    ::dto::create((Complex *)local_148,payload.field_2._8_8_,&local_168,
                  (string *)((long)&cmd.field_2 + 8),seq);
    std::__cxx11::string::~string((string *)&local_168);
    poVar2 = std::operator<<((ostream *)&std::cerr,"[PACKETGEN] ");
    poVar2 = operator<<(poVar2,(Complex *)local_148);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    ::dto::marshall<dto::Complex>(&local_188,(Complex *)local_148);
    std::__cxx11::string::operator=
              ((string *)(dto.payload.field_2._M_local_buf + 8),(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    ::dto::Complex::~Complex((Complex *)local_148);
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,local_60);
    ::dto::create((Simple *)local_c8,payload.field_2._8_8_,&local_e8,
                  (string *)((long)&cmd.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_e8);
    poVar2 = std::operator<<((ostream *)&std::cerr,"[PACKETGEN] ");
    poVar2 = operator<<(poVar2,(Simple *)local_c8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    ::dto::marshall<dto::Simple>((string *)((long)&dto_1.payload.field_2 + 8),(Simple *)local_c8);
    std::__cxx11::string::operator=
              ((string *)(dto.payload.field_2._M_local_buf + 8),
               (string *)(dto_1.payload.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dto_1.payload.field_2._M_local_buf + 8));
    ::dto::Simple::~Simple((Simple *)local_c8);
  }
  std::operator<<((ostream *)&std::cout,(string *)(dto.payload.field_2._M_local_buf + 8));
  param._4_4_ = 0;
  std::__cxx11::string::~string((string *)(dto.payload.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
  return param._4_4_;
}

Assistant:

int main() {
  int is_simple;
  uint64_t param, seq;
  std::string payload, cmd;
  std::getline(std::cin, cmd);
  std::getline(std::cin, payload);
  std::cin >> is_simple >> param >> seq;

  std::string serial;
  if (is_simple) {
    Simple dto = create(seq, cmd, payload);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  } else {
    Complex dto = create(seq, cmd, payload, param);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  }

  std::cout << serial;

  return 0;
}